

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O3

void cf2_glyphpath_computeOffset
               (CF2_GlyphPath glyphpath,CF2_F16Dot16 x1,CF2_F16Dot16 y1,CF2_F16Dot16 x2,
               CF2_F16Dot16 y2,CF2_F16Dot16 *x,CF2_F16Dot16 *y)

{
  FT_Fast *pFVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  
  iVar3 = x2 - x1;
  iVar6 = y2 - y1;
  iVar4 = -iVar6;
  iVar2 = -iVar3;
  if (glyphpath->font->reverseWinding == '\0') {
    iVar4 = iVar6;
    iVar2 = iVar3;
  }
  *y = 0;
  *x = 0;
  if (glyphpath->darken == '\0') {
    return;
  }
  pFVar1 = &glyphpath->callbacks->windingMomentum;
  *pFVar1 = *pFVar1 + ((iVar6 >> 0x10) * (x1 >> 0x10) - (iVar3 >> 0x10) * (y1 >> 0x10));
  if (iVar2 < 0) {
    if (iVar4 < 0) {
      if (SBORROW4(iVar4 * -2,-iVar2) != iVar4 * -2 + iVar2 < 0) goto LAB_00235fe9;
      iVar3 = glyphpath->xOffset;
      if (SBORROW4(iVar2 * -2,-iVar4) != iVar2 * -2 + iVar4 < 0) goto LAB_00236054;
      lVar5 = (long)iVar3 * -0xb332;
    }
    else {
      if (SBORROW4(iVar4 * 2,-iVar2) != iVar4 * 2 + iVar2 < 0) {
LAB_00235fe9:
        *x = 0;
        iVar4 = glyphpath->yOffset * 2;
        goto LAB_002360ac;
      }
      iVar3 = glyphpath->xOffset;
      if (iVar4 != iVar2 * -2 && SBORROW4(iVar4,iVar2 * -2) == iVar4 + iVar2 * 2 < 0)
      goto LAB_00235fc6;
      lVar5 = (long)iVar3 * 0xb333;
    }
    *x = (CF2_F16Dot16)((ulong)(lVar5 + 0x8000 + (lVar5 >> 0x3f)) >> 0x10);
    lVar5 = (long)glyphpath->yOffset * 0x1b333;
LAB_0023609b:
    iVar4 = (int)((ulong)(lVar5 + 0x8000 + (lVar5 >> 0x3f)) >> 0x10);
  }
  else {
    iVar3 = iVar4 * 2;
    if (iVar4 < 0) {
      if (iVar2 == iVar4 * -2 || SBORROW4(iVar2,iVar4 * -2) != iVar2 + iVar3 < 0) {
        iVar3 = glyphpath->xOffset;
        if (SBORROW4(iVar2 * 2,-iVar4) != iVar2 * 2 + iVar4 < 0) {
LAB_00236054:
          *x = -iVar3;
          goto LAB_00236059;
        }
        lVar5 = (long)iVar3 * -0xb332;
        goto LAB_00236016;
      }
    }
    else if (iVar2 == iVar3 || SBORROW4(iVar2,iVar3) != iVar2 + iVar4 * -2 < 0) {
      iVar3 = glyphpath->xOffset;
      if (iVar4 != iVar2 * 2 && SBORROW4(iVar4,iVar2 * 2) == iVar4 + iVar2 * -2 < 0) {
LAB_00235fc6:
        *x = iVar3;
LAB_00236059:
        iVar4 = glyphpath->yOffset;
        goto LAB_002360ac;
      }
      lVar5 = (long)iVar3 * 0xb333;
LAB_00236016:
      *x = (CF2_F16Dot16)((ulong)(lVar5 + 0x8000 + (lVar5 >> 0x3f)) >> 0x10);
      lVar5 = (long)glyphpath->yOffset * 0x4ccd;
      goto LAB_0023609b;
    }
    *x = 0;
    iVar4 = 0;
  }
LAB_002360ac:
  *y = iVar4;
  return;
}

Assistant:

static void
  cf2_glyphpath_computeOffset( CF2_GlyphPath  glyphpath,
                               CF2_Fixed      x1,
                               CF2_Fixed      y1,
                               CF2_Fixed      x2,
                               CF2_Fixed      y2,
                               CF2_Fixed*     x,
                               CF2_Fixed*     y )
  {
    CF2_Fixed  dx = SUB_INT32( x2, x1 );
    CF2_Fixed  dy = SUB_INT32( y2, y1 );


    /* note: negative offsets don't work here; negate deltas to change */
    /* quadrants, below                                                */
    if ( glyphpath->font->reverseWinding )
    {
      dx = NEG_INT32( dx );
      dy = NEG_INT32( dy );
    }

    *x = *y = 0;

    if ( !glyphpath->darken )
        return;

    /* add momentum for this path element */
    glyphpath->callbacks->windingMomentum =
      ADD_INT32( glyphpath->callbacks->windingMomentum,
                 cf2_getWindingMomentum( x1, y1, x2, y2 ) );

    /* note: allow mixed integer and fixed multiplication here */
    if ( dx >= 0 )
    {
      if ( dy >= 0 )
      {
        /* first quadrant, +x +y */

        if ( dx > MUL_INT32( 2, dy ) )
        {
          /* +x */
          *x = 0;
          *y = 0;
        }
        else if ( dy > MUL_INT32( 2, dx ) )
        {
          /* +y */
          *x = glyphpath->xOffset;
          *y = glyphpath->yOffset;
        }
        else
        {
          /* +x +y */
          *x = FT_MulFix( cf2_doubleToFixed( 0.7 ),
                          glyphpath->xOffset );
          *y = FT_MulFix( cf2_doubleToFixed( 1.0 - 0.7 ),
                          glyphpath->yOffset );
        }
      }
      else
      {
        /* fourth quadrant, +x -y */

        if ( dx > MUL_INT32( -2, dy ) )
        {
          /* +x */
          *x = 0;
          *y = 0;
        }
        else if ( NEG_INT32( dy ) > MUL_INT32( 2, dx ) )
        {
          /* -y */
          *x = NEG_INT32( glyphpath->xOffset );
          *y = glyphpath->yOffset;
        }
        else
        {
          /* +x -y */
          *x = FT_MulFix( cf2_doubleToFixed( -0.7 ),
                          glyphpath->xOffset );
          *y = FT_MulFix( cf2_doubleToFixed( 1.0 - 0.7 ),
                          glyphpath->yOffset );
        }
      }
    }
    else
    {
      if ( dy >= 0 )
      {
        /* second quadrant, -x +y */

        if ( NEG_INT32( dx ) > MUL_INT32( 2, dy ) )
        {
          /* -x */
          *x = 0;
          *y = MUL_INT32( 2, glyphpath->yOffset );
        }
        else if ( dy > MUL_INT32( -2, dx ) )
        {
          /* +y */
          *x = glyphpath->xOffset;
          *y = glyphpath->yOffset;
        }
        else
        {
          /* -x +y */
          *x = FT_MulFix( cf2_doubleToFixed( 0.7 ),
                          glyphpath->xOffset );
          *y = FT_MulFix( cf2_doubleToFixed( 1.0 + 0.7 ),
                          glyphpath->yOffset );
        }
      }
      else
      {
        /* third quadrant, -x -y */

        if ( NEG_INT32( dx ) > MUL_INT32( -2, dy ) )
        {
          /* -x */
          *x = 0;
          *y = MUL_INT32( 2, glyphpath->yOffset );
        }
        else if ( NEG_INT32( dy ) > MUL_INT32( -2, dx ) )
        {
          /* -y */
          *x = NEG_INT32( glyphpath->xOffset );
          *y = glyphpath->yOffset;
        }
        else
        {
          /* -x -y */
          *x = FT_MulFix( cf2_doubleToFixed( -0.7 ),
                          glyphpath->xOffset );
          *y = FT_MulFix( cf2_doubleToFixed( 1.0 + 0.7 ),
                          glyphpath->yOffset );
        }
      }
    }
  }